

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::VertexExpanderShader::genGeometrySource_abi_cxx11_
          (string *__return_storage_ptr__,VertexExpanderShader *this,ContextType *contextType,
          GeometryShaderInputType inputType,GeometryShaderOutputType outputType)

{
  ostream *poVar1;
  size_t sVar2;
  GeometryShaderInputType inputType_00;
  GeometryShaderOutputType outputType_00;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1a0 [8];
  ostringstream str;
  GeometryShaderOutputType outputType_local;
  GeometryShaderInputType inputType_local;
  ContextType *contextType_local;
  VertexExpanderShader *this_local;
  
  str._368_4_ = outputType;
  str._372_4_ = inputType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::operator<<((ostream *)local_1a0,"${GLSL_VERSION_DECL}\n");
  std::operator<<((ostream *)local_1a0,"${GLSL_EXT_GEOMETRY_SHADER}");
  poVar1 = std::operator<<((ostream *)local_1a0,"layout(");
  inputTypeToGLString_abi_cxx11_
            (&local_1d0,(_anonymous_namespace_ *)(ulong)(uint)str._372_4_,inputType_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  std::operator<<(poVar1,") in;\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  poVar1 = std::operator<<((ostream *)local_1a0,"layout(");
  outputTypeToGLString_abi_cxx11_
            (&local_1f0,(_anonymous_namespace_ *)(ulong)(uint)str._368_4_,outputType_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,", max_vertices = ");
  sVar2 = anon_unknown_1::VertexExpanderShader::calcOutputVertices
                    ((VertexExpanderShader *)this,str._372_4_);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::operator<<(poVar1,") out;");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::operator<<((ostream *)local_1a0,"\n");
  std::operator<<((ostream *)local_1a0,
                  "in highp vec4 v_geom_FragColor[];\nout highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n\tconst highp vec4 offset0 = vec4(-0.07, -0.01, 0.0, 0.0);\n\tconst highp vec4 offset1 = vec4( 0.03, -0.03, 0.0, 0.0);\n\tconst highp vec4 offset2 = vec4(-0.01,  0.08, 0.0, 0.0);\n\t      highp vec4 yoffset = float(gl_PrimitiveIDIn) * vec4(0.02, 0.1, 0.0, 0.0);\n\n\tfor (highp int ndx = 0; ndx < gl_in.length(); ndx++)\n\t{\n\t\tgl_Position = gl_in[ndx].gl_Position + offset0 + yoffset;\n\t\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n\t\tEmitVertex();\n\n\t\tgl_Position = gl_in[ndx].gl_Position + offset1 + yoffset;\n\t\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n\t\tEmitVertex();\n\n\t\tgl_Position = gl_in[ndx].gl_Position + offset2 + yoffset;\n\t\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n\t\tEmitVertex();\n\t\tEndPrimitive();\n\t}\n}\n"
                 );
  std::__cxx11::ostringstream::str();
  anon_unknown_1::specializeShader(__return_storage_ptr__,&local_210,contextType);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string	VertexExpanderShader::genGeometrySource (const glu::ContextType& contextType, rr::GeometryShaderInputType inputType, rr::GeometryShaderOutputType outputType) const
{
	std::ostringstream str;

	str << "${GLSL_VERSION_DECL}\n";
	str << "${GLSL_EXT_GEOMETRY_SHADER}";
	str << "layout(" << inputTypeToGLString(inputType) << ") in;\n";
	str << "layout(" << outputTypeToGLString(outputType) << ", max_vertices = " << calcOutputVertices(inputType) << ") out;";
	str << "\n";
	str << s_expandShaderSourceGeometryBody;

	return specializeShader(str.str(), contextType);
}